

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringRef Catch::anon_unknown_26::extractFilenamePart(StringRef filename)

{
  char cVar1;
  size_type in_RSI;
  char *in_RDI;
  bool bVar2;
  size_t nameStart;
  size_t lastDot;
  size_type local_30;
  size_type local_28;
  StringRef in_stack_fffffffffffffff0;
  
  local_28 = StringRef::size((StringRef *)&stack0xffffffffffffffe0);
  while( true ) {
    bVar2 = false;
    if (local_28 != 0) {
      cVar1 = StringRef::operator[]((StringRef *)&stack0xffffffffffffffe0,local_28 - 1);
      bVar2 = cVar1 != '.';
    }
    if (!bVar2) break;
    local_28 = local_28 - 1;
  }
  if (local_28 == 0) {
    memset(&stack0xfffffffffffffff0,0,0x10);
    StringRef::StringRef((StringRef *)&stack0xfffffffffffffff0);
  }
  else {
    do {
      local_30 = local_28 - 1;
      bVar2 = false;
      if (local_30 != 0) {
        cVar1 = StringRef::operator[]((StringRef *)&stack0xffffffffffffffe0,local_28 - 2);
        bVar2 = false;
        if (cVar1 != '/') {
          cVar1 = StringRef::operator[]((StringRef *)&stack0xffffffffffffffe0,local_28 - 2);
          bVar2 = cVar1 != '\\';
        }
      }
      local_28 = local_30;
    } while (bVar2);
    in_stack_fffffffffffffff0 =
         StringRef::substr((StringRef *)in_stack_fffffffffffffff0.m_start,in_RSI,(size_type)in_RDI);
  }
  return in_stack_fffffffffffffff0;
}

Assistant:

StringRef extractFilenamePart(StringRef filename) {
            size_t lastDot = filename.size();
            while (lastDot > 0 && filename[lastDot - 1] != '.') {
                --lastDot;
            }
            // In theory we could have filename without any extension in it
            if ( lastDot == 0 ) { return StringRef(); }

            --lastDot;
            size_t nameStart = lastDot;
            while (nameStart > 0 && filename[nameStart - 1] != '/' && filename[nameStart - 1] != '\\') {
                --nameStart;
            }

            return filename.substr(nameStart, lastDot - nameStart);
        }